

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O3

void __thiscall higan::Acceptor::OnNewConnectionInternal(Acceptor *this)

{
  int fd;
  undefined1 local_48 [8];
  InetAddress address;
  
  InetAddress::InetAddress((InetAddress *)local_48);
  fd = Socket::Accept(&this->listening_socket_,(InetAddress *)local_48);
  if ((this->newconnection_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
    Socket::CloseFd(fd);
  }
  else {
    address._36_4_ = fd;
    (*(this->newconnection_callback_)._M_invoker)
              ((_Any_data *)&this->newconnection_callback_,(int *)&address.field_0x24,
               (InetAddress *)local_48);
  }
  if (local_48 != (undefined1  [8])&address.ip_._M_string_length) {
    operator_delete((void *)local_48,address.ip_._M_string_length + 1);
  }
  return;
}

Assistant:

void Acceptor::OnNewConnectionInternal()
{
	InetAddress address{};
	int client_fd = listening_socket_.Accept(&address);

	if (newconnection_callback_)
	{
		newconnection_callback_(client_fd, address);
	}
	else
	{
		Socket::CloseFd(client_fd);
	}
}